

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollfd.c
# Opt level: O3

void lws_accept_modulation(lws_context *context,lws_context_per_thread *pt,int allow)

{
  lws_vhost *vh;
  __pthread_internal_list *p_Var1;
  bool bVar2;
  lws_pollargs pa1;
  lws_pollargs local_34;
  
  if (context != (lws_context *)0x0) {
    bVar2 = (int)pt == 0;
    do {
      for (p_Var1 = (context->smd).lock_messages.__data.__list.__next;
          p_Var1 != (__pthread_internal_list *)0x0; p_Var1 = p_Var1->__next) {
        _lws_change_pollfd((lws *)(p_Var1 + -0x28),(uint)bVar2,(uint)!bVar2,&local_34);
      }
      context = *(lws_context **)((long)&(context->smd).lock_messages + 8);
    } while (context != (lws_context *)0x0);
  }
  return;
}

Assistant:

static void
lws_accept_modulation(struct lws_context *context,
		      struct lws_context_per_thread *pt, int allow)
{
	struct lws_vhost *vh = context->vhost_list;
	struct lws_pollargs pa1;

	while (vh) {
		lws_start_foreach_dll(struct lws_dll2 *, d,
				      lws_dll2_get_head(&vh->listen_wsi)) {
			struct lws *wsi = lws_container_of(d, struct lws,
							   listen_list);

			_lws_change_pollfd(wsi, allow ? 0 : LWS_POLLIN,
						allow ? LWS_POLLIN : 0, &pa1);
		} lws_end_foreach_dll(d);

		vh = vh->vhost_next;
	}
}